

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.cpp
# Opt level: O2

void __thiscall
HighsPseudocostInitialization::HighsPseudocostInitialization
          (HighsPseudocostInitialization *this,HighsPseudocost *pscost,HighsInt maxCount)

{
  double dVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  allocator_type local_5a;
  allocator_type local_59;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->pseudocostup,&pscost->pseudocostup);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->pseudocostdown,&pscost->pseudocostdown);
  local_38 = &this->pseudocostdown;
  std::vector<int,_std::allocator<int>_>::vector(&this->nsamplesup,&pscost->nsamplesup);
  local_40 = &this->nsamplesup;
  std::vector<int,_std::allocator<int>_>::vector(&this->nsamplesdown,&pscost->nsamplesdown);
  local_50 = &this->inferencesup;
  local_48 = &this->nsamplesdown;
  std::vector<double,_std::allocator<double>_>::vector(local_50,&pscost->inferencesup);
  local_58 = &this->inferencesdown;
  std::vector<double,_std::allocator<double>_>::vector(local_58,&pscost->inferencesdown);
  std::vector<int,_std::allocator<int>_>::vector(&this->ninferencesup,&pscost->ninferencesup);
  std::vector<int,_std::allocator<int>_>::vector(&this->ninferencesdown,&pscost->ninferencesdown);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->conflictscoreup,
             (long)(pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_59);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->conflictscoredown,
             (long)(pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_5a);
  dVar1 = pscost->inferences_total;
  this->cost_total = pscost->cost_total;
  this->inferences_total = dVar1;
  dVar1 = pscost->conflict_avg_score;
  lVar10 = pscost->nsamplestotal;
  if (0 < pscost->nsamplestotal) {
    lVar10 = 1;
  }
  this->nsamplestotal = lVar10;
  lVar10 = 1;
  if (pscost->ninferencestotal < 1) {
    lVar10 = pscost->ninferencestotal;
  }
  this->ninferencestotal = lVar10;
  piVar2 = (this->nsamplesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = (long)(this->pseudocostup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->pseudocostup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  this->conflict_avg_score = dVar1 / ((double)(int)(uVar13 >> 3) * pscost->conflict_weight);
  piVar3 = (this->nsamplesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->ninferencesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->ninferencesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pscost->conflictscoredown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->conflictscoredown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar11 = 0; (uVar13 >> 1 & 0x3fffffffc) != uVar11; uVar11 = uVar11 + 4) {
    iVar12 = *(int *)((long)piVar2 + uVar11);
    if (maxCount <= iVar12) {
      iVar12 = maxCount;
    }
    *(int *)((long)piVar2 + uVar11) = iVar12;
    iVar12 = *(int *)((long)piVar3 + uVar11);
    if (maxCount <= iVar12) {
      iVar12 = maxCount;
    }
    *(int *)((long)piVar3 + uVar11) = iVar12;
    iVar12 = *(int *)((long)piVar4 + uVar11);
    if (0 < iVar12) {
      iVar12 = 1;
    }
    *(int *)((long)piVar4 + uVar11) = iVar12;
    iVar12 = *(int *)((long)piVar5 + uVar11);
    if (0 < iVar12) {
      iVar12 = 1;
    }
    *(int *)((long)piVar5 + uVar11) = iVar12;
    *(double *)((long)pdVar8 + uVar11 * 2) =
         *(double *)((long)pdVar6 + uVar11 * 2) / pscost->conflict_weight;
    *(double *)((long)pdVar9 + uVar11 * 2) =
         *(double *)((long)pdVar7 + uVar11 * 2) / pscost->conflict_weight;
  }
  return;
}

Assistant:

HighsPseudocostInitialization::HighsPseudocostInitialization(
    const HighsPseudocost& pscost, HighsInt maxCount)
    : pseudocostup(pscost.pseudocostup),
      pseudocostdown(pscost.pseudocostdown),
      nsamplesup(pscost.nsamplesup),
      nsamplesdown(pscost.nsamplesdown),
      inferencesup(pscost.inferencesup),
      inferencesdown(pscost.inferencesdown),
      ninferencesup(pscost.ninferencesup),
      ninferencesdown(pscost.ninferencesdown),
      conflictscoreup(pscost.conflictscoreup.size()),
      conflictscoredown(pscost.conflictscoreup.size()),
      cost_total(pscost.cost_total),
      inferences_total(pscost.inferences_total),
      conflict_avg_score(pscost.conflict_avg_score),
      nsamplestotal(std::min(int64_t{1}, pscost.nsamplestotal)),
      ninferencestotal(std::min(int64_t{1}, pscost.ninferencestotal)) {
  HighsInt ncol = pseudocostup.size();
  conflict_avg_score /= ncol * pscost.conflict_weight;
  for (HighsInt i = 0; i != ncol; ++i) {
    nsamplesup[i] = std::min(nsamplesup[i], maxCount);
    nsamplesdown[i] = std::min(nsamplesdown[i], maxCount);
    ninferencesup[i] = std::min(ninferencesup[i], HighsInt{1});
    ninferencesdown[i] = std::min(ninferencesdown[i], HighsInt{1});
    conflictscoreup[i] = pscost.conflictscoreup[i] / pscost.conflict_weight;
    conflictscoredown[i] = pscost.conflictscoredown[i] / pscost.conflict_weight;
  }
}